

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void av1_init_motion_fpf(search_site_config *cfg,int stride)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int local_58;
  short local_54;
  undefined2 uStack_52;
  short local_50;
  undefined4 local_4e;
  short local_4a;
  undefined2 local_48;
  short local_46;
  short local_44;
  short local_42;
  FULLPEL_MV search_site_mvs [13];
  
  cfg->site[10][0].mv.row = 0;
  cfg->site[10][0].mv.col = 0;
  cfg->site[10][0].offset = 0;
  cfg->stride = stride;
  piVar2 = &cfg->site[10][0].offset;
  uVar4 = 0x400;
  lVar6 = 10;
  for (iVar3 = 0; iVar3 != 0xb; iVar3 = iVar3 + 1) {
    iVar1 = (int)((double)uVar4 * 0.41);
    if ((int)((double)uVar4 * 0.41) < 2) {
      iVar1 = 1;
    }
    local_58 = 0;
    local_50 = (short)uVar4;
    local_54 = -local_50;
    uStack_52 = 0;
    local_4e = 0;
    local_4a = local_54;
    local_48 = 0;
    local_46 = local_50;
    local_44 = local_54;
    search_site_mvs[0].col = (int16_t)iVar1;
    local_42 = -search_site_mvs[0].col;
    search_site_mvs[0].row = local_50;
    search_site_mvs[1].row = local_42;
    search_site_mvs[1].col = local_50;
    search_site_mvs[2].row = search_site_mvs[0].col;
    search_site_mvs[2].col = local_54;
    search_site_mvs[3].row = local_54;
    search_site_mvs[3].col = search_site_mvs[0].col;
    search_site_mvs[4].row = local_50;
    search_site_mvs[4].col = local_42;
    search_site_mvs[5].row = search_site_mvs[0].col;
    search_site_mvs[5].col = local_50;
    search_site_mvs[6].row = local_42;
    search_site_mvs[6].col = local_54;
    for (uVar5 = 0; (uint)(uVar4 != 1) * 4 + 9 != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = (&local_58)[uVar5];
      piVar2[uVar5 * 2 + -1] = iVar1;
      piVar2[uVar5 * 2] = (iVar1 >> 0x10) + (short)iVar1 * stride;
    }
    cfg->searches_per_step[lVar6] = (uint)(uVar4 != 1) * 4 + 8;
    cfg->radius[lVar6] = uVar4;
    lVar6 = lVar6 + -1;
    uVar4 = uVar4 >> 1;
    piVar2 = piVar2 + -0x22;
  }
  cfg->num_search_steps = 0xb;
  return;
}

Assistant:

void av1_init_motion_fpf(search_site_config *cfg, int stride) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  for (int radius = MAX_FIRST_STEP; radius > 0; radius /= 2) {
    // Generate offsets for 8 search sites per step.
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if (radius == 1) num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}